

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_field.cc
# Opt level: O3

bool __thiscall Field::DoTraverse(Field *this,DataDepVisitor *visitor)

{
  bool bVar1;
  AttrList *pAVar2;
  pointer ppAVar3;
  
  if ((this->type_ != (Type *)0x0) &&
     (bVar1 = DataDepElement::Traverse(&this->type_->super_DataDepElement,visitor), !bVar1)) {
    return false;
  }
  pAVar2 = this->attrs_;
  bVar1 = true;
  if (pAVar2 != (AttrList *)0x0) {
    for (ppAVar3 = (pAVar2->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppAVar3 !=
        (pAVar2->super__Vector_base<Attr_*,_std::allocator<Attr_*>_>)._M_impl.
        super__Vector_impl_data._M_finish; ppAVar3 = ppAVar3 + 1) {
      bVar1 = DataDepElement::Traverse(&(*ppAVar3)->super_DataDepElement,visitor);
      if (!bVar1) {
        return bVar1;
      }
      pAVar2 = this->attrs_;
    }
  }
  return bVar1;
}

Assistant:

bool Field::DoTraverse(DataDepVisitor* visitor)
	{
	// Check parameterized type
	if ( type_ && ! type_->Traverse(visitor) )
		return false;
	foreach (i, AttrList, attrs_)
		if ( ! (*i)->Traverse(visitor) )
			return false;
	return true;
	}